

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

void md_build_mark_char_map(MD_CTX *ctx)

{
  long in_RDI;
  int i;
  undefined4 local_c;
  
  memset((void *)(in_RDI + 0xa0),0,0x100);
  *(undefined1 *)(in_RDI + 0xfc) = 1;
  *(undefined1 *)(in_RDI + 0xca) = 1;
  *(undefined1 *)(in_RDI + 0xff) = 1;
  *(undefined1 *)(in_RDI + 0x100) = 1;
  *(undefined1 *)(in_RDI + 0xc6) = 1;
  *(undefined1 *)(in_RDI + 0xdb) = 1;
  *(undefined1 *)(in_RDI + 0xdc) = 1;
  *(undefined1 *)(in_RDI + 0xde) = 1;
  *(undefined1 *)(in_RDI + 0xfb) = 1;
  *(undefined1 *)(in_RDI + 0xc1) = 1;
  *(undefined1 *)(in_RDI + 0xfd) = 1;
  *(undefined1 *)(in_RDI + 0xa0) = 1;
  if ((*(uint *)(in_RDI + 0x14) & 0x200) != 0) {
    *(undefined1 *)(in_RDI + 0x11e) = 1;
  }
  if ((*(uint *)(in_RDI + 0x14) & 0x1000) != 0) {
    *(undefined1 *)(in_RDI + 0xc4) = 1;
  }
  if ((*(uint *)(in_RDI + 0x14) & 8) != 0) {
    *(undefined1 *)(in_RDI + 0xe0) = 1;
  }
  if ((*(uint *)(in_RDI + 0x14) & 4) != 0) {
    *(undefined1 *)(in_RDI + 0xda) = 1;
  }
  if ((*(uint *)(in_RDI + 0x14) & 0x400) != 0) {
    *(undefined1 *)(in_RDI + 0xce) = 1;
  }
  if (((*(uint *)(in_RDI + 0x14) & 0x100) != 0) || ((*(uint *)(in_RDI + 0x14) & 0x2000) != 0)) {
    *(undefined1 *)(in_RDI + 0x11c) = 1;
  }
  if ((*(uint *)(in_RDI + 0x14) & 1) != 0) {
    for (local_c = 0; local_c < 0x100; local_c = local_c + 1) {
      if ((((local_c == 0x20) || (local_c == 9)) || (local_c == 0xb)) || (local_c == 0xc)) {
        *(undefined1 *)(in_RDI + 0xa0 + (long)local_c) = 1;
      }
    }
  }
  return;
}

Assistant:

static void
md_build_mark_char_map(MD_CTX* ctx)
{
    memset(ctx->mark_char_map, 0, sizeof(ctx->mark_char_map));

    ctx->mark_char_map['\\'] = 1;
    ctx->mark_char_map['*'] = 1;
    ctx->mark_char_map['_'] = 1;
    ctx->mark_char_map['`'] = 1;
    ctx->mark_char_map['&'] = 1;
    ctx->mark_char_map[';'] = 1;
    ctx->mark_char_map['<'] = 1;
    ctx->mark_char_map['>'] = 1;
    ctx->mark_char_map['['] = 1;
    ctx->mark_char_map['!'] = 1;
    ctx->mark_char_map[']'] = 1;
    ctx->mark_char_map['\0'] = 1;

    if(ctx->parser.flags & MD_FLAG_STRIKETHROUGH)
        ctx->mark_char_map['~'] = 1;

    if(ctx->parser.flags & MD_FLAG_LATEXMATHSPANS)
        ctx->mark_char_map['$'] = 1;

    if(ctx->parser.flags & MD_FLAG_PERMISSIVEEMAILAUTOLINKS)
        ctx->mark_char_map['@'] = 1;

    if(ctx->parser.flags & MD_FLAG_PERMISSIVEURLAUTOLINKS)
        ctx->mark_char_map[':'] = 1;

    if(ctx->parser.flags & MD_FLAG_PERMISSIVEWWWAUTOLINKS)
        ctx->mark_char_map['.'] = 1;

    if((ctx->parser.flags & MD_FLAG_TABLES) || (ctx->parser.flags & MD_FLAG_WIKILINKS))
        ctx->mark_char_map['|'] = 1;

    if(ctx->parser.flags & MD_FLAG_COLLAPSEWHITESPACE) {
        int i;

        for(i = 0; i < (int) sizeof(ctx->mark_char_map); i++) {
            if(ISWHITESPACE_(i))
                ctx->mark_char_map[i] = 1;
        }
    }
}